

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_init.c
# Opt level: O3

int ares_query_timeout_cmp_cb(void *arg1,void *arg2)

{
  int iVar1;
  
  iVar1 = 1;
  if ((*(long *)((long)arg1 + 0x18) <= *(long *)((long)arg2 + 0x18)) &&
     (iVar1 = -1, *(long *)((long)arg2 + 0x18) <= *(long *)((long)arg1 + 0x18))) {
    iVar1 = 1;
    if (*(uint *)((long)arg1 + 0x20) <= *(uint *)((long)arg2 + 0x20)) {
      iVar1 = -(uint)(*(uint *)((long)arg1 + 0x20) < *(uint *)((long)arg2 + 0x20));
    }
  }
  return iVar1;
}

Assistant:

static int ares_query_timeout_cmp_cb(const void *arg1, const void *arg2)
{
  const ares_query_t *q1 = arg1;
  const ares_query_t *q2 = arg2;

  if (q1->timeout.sec > q2->timeout.sec) {
    return 1;
  }
  if (q1->timeout.sec < q2->timeout.sec) {
    return -1;
  }

  if (q1->timeout.usec > q2->timeout.usec) {
    return 1;
  }
  if (q1->timeout.usec < q2->timeout.usec) {
    return -1;
  }

  return 0;
}